

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

double CWire::GetSegmentListCost(vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList)

{
  pointer ppCVar1;
  pointer ppCVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  double dVar9;
  
  if (pSegmentList == (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
    __assert_fail("pSegmentList",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x275,"static double CWire::GetSegmentListCost(vector<CSegment *> *)");
  }
  iVar3 = (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ -
          (int)(CObject::m_pDesign->super_CBBox).m_cMinZ;
  ppCVar1 = (pSegmentList->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (pSegmentList->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar4 = (uint)((long)ppCVar2 - (long)ppCVar1 >> 3);
  if ((int)uVar4 < 1) {
    iVar5 = 1;
  }
  else {
    if (ppCVar2 == ppCVar1) {
      pcVar7 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
      dVar9 = (double)std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
      if ((-1 < (int)uVar4) &&
         ((int)uVar4 <
          (int)((ulong)(*(long *)(pcVar7 + 0x30) - *(long *)(pcVar7 + 0x28)) >> 3) * -0x55555555)) {
        return dVar9;
      }
      __assert_fail("iIndex>=0&&iIndex<GetNumSegmentList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x286,"vector<CSegment *> *CWire::GetSegmentList(int)");
    }
    iVar5 = 1;
    uVar6 = 0;
    iVar8 = iVar3;
    do {
      iVar3 = (int)ppCVar1[uVar6]->m_pPointE->m_cZ;
      if (iVar5 <= iVar3) {
        iVar5 = iVar3;
      }
      if (iVar8 < iVar3) {
        iVar3 = iVar8;
      }
      uVar6 = uVar6 + 1;
      iVar8 = iVar3;
    } while ((uVar4 & 0x7fffffff) != uVar6);
  }
  return (double)((iVar5 - iVar3) + 1);
}

Assistant:

double CWire::GetSegmentListCost(vector<CSegment*>* pSegmentList)
{
	assert(pSegmentList);

	// via cost [2/10/2007 thyeros]
	int	iMaxZ	=	LAYER_METAL1;
	int	iMinZ	=	GetDesign()->T();

	for(int i=0,s=pSegmentList->size();i<s;++i)
	{
		iMaxZ	=	MAX(iMaxZ,pSegmentList->at(i)->m_pPointE->Z());
		iMinZ	=	MIN(iMinZ,pSegmentList->at(i)->m_pPointE->Z());
	}

	return	iMaxZ-iMinZ+1;
}